

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O1

void print_number(int64_t x)

{
  byte *pbVar1;
  ulong uVar2;
  undefined1 *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  char buffer [30];
  byte abStack_38 [28];
  undefined1 local_1c;
  undefined1 local_1b;
  
  uVar2 = -x;
  if (0 < x) {
    uVar2 = x;
  }
  uVar6 = 0;
  if (uVar2 - 1 < 99999999) {
    uVar5 = uVar2;
    uVar4 = 0;
    do {
      uVar6 = uVar4 + 1;
      if (0x5f5e0fe < uVar5 * 10 - 1) break;
      uVar5 = uVar5 * 10;
      bVar9 = uVar4 < 5;
      uVar4 = uVar6;
    } while (bVar9);
  }
  if (uVar6 < 6) {
    iVar7 = uVar6 - 6;
    do {
      uVar5 = uVar2;
      uVar2 = uVar5 / 10;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
    uVar5 = (ulong)(4 < uVar5 % 10);
  }
  else {
    uVar5 = 0;
  }
  uVar2 = uVar2 + uVar5;
  local_1b = 0;
  if (uVar6 == 0) {
    local_1c = 0x30;
    lVar8 = 0x1b;
  }
  else {
    lVar8 = 0x1c;
    uVar5 = uVar2;
    do {
      uVar2 = uVar5 / 10;
      abStack_38[lVar8] = (char)uVar5 + (char)uVar2 * -10 | 0x30;
      lVar8 = lVar8 + -1;
      uVar6 = uVar6 - 1;
      uVar5 = uVar2;
    } while (uVar6 != 0);
  }
  abStack_38[lVar8] = 0x2e;
  uVar5 = 0;
  pbVar1 = abStack_38;
  do {
    puVar3 = pbVar1;
    puVar3[lVar8 + -1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    uVar5 = uVar5 + 1;
    bVar9 = 9 < uVar2;
    pbVar1 = puVar3 + -1;
    uVar2 = uVar2 / 10;
  } while (bVar9);
  if (x < 0) {
    puVar3[lVar8 + -2] = 0x2d;
    lVar8 = (lVar8 + -1) - uVar5;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  else {
    lVar8 = lVar8 - uVar5;
  }
  printf("%5.*s",uVar5 & 0xffffffff,abStack_38 + lVar8);
  printf("%-*s",6,abStack_38 + (int)uVar5 + lVar8);
  return;
}

Assistant:

static void print_number(const int64_t x) {
    int64_t x_abs, y;
    int c, i, rounding, g; /* g = integer part size, c = fractional part size */
    size_t ptr;
    char buffer[30];

    if (x == INT64_MIN) {
        /* Prevent UB. */
        printf("ERR");
        return;
    }
    x_abs = x < 0 ? -x : x;

    /* Determine how many decimals we want to show (more than FP_EXP makes no
     * sense). */
    y = x_abs;
    c = 0;
    while (y > 0LL && y < 100LL * FP_MULT && c < FP_EXP) {
        y *= 10LL;
        c++;
    }

    /* Round to 'c' decimals. */
    y = x_abs;
    rounding = 0;
    for (i = c; i < FP_EXP; ++i) {
        rounding = (y % 10) >= 5;
        y /= 10;
    }
    y += rounding;

    /* Format and print the number. */
    ptr = sizeof(buffer) - 1;
    buffer[ptr] = 0;
    g = 0;
    if (c != 0) { /* non zero fractional part */
        for (i = 0; i < c; ++i) {
            buffer[--ptr] = '0' + (y % 10);
            y /= 10;
        }
    } else if (c == 0) { /* fractional part is 0 */
        buffer[--ptr] = '0'; 
    }
    buffer[--ptr] = '.';
    do {
        buffer[--ptr] = '0' + (y % 10);
        y /= 10;
        g++;
    } while (y != 0);
    if (x < 0) {
        buffer[--ptr] = '-';
        g++;
    }
    printf("%5.*s", g, &buffer[ptr]); /* Prints integer part */
    printf("%-*s", FP_EXP, &buffer[ptr + g]); /* Prints fractional part */
}